

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O3

GeneratorTracker *
Catch::Generators::GeneratorTracker::acquire(TrackerContext *ctx,NameAndLocation *nameAndLocation)

{
  ITracker *pIVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  GeneratorTracker *pGVar4;
  ITrackerPtr thisTracker;
  undefined1 local_41;
  GeneratorTracker *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  GeneratorTracker *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  ITracker *local_20;
  
  pIVar1 = ctx->m_currentTracker;
  bVar2 = TestCaseTracking::operator==(&pIVar1->m_nameAndLocation,nameAndLocation);
  if (bVar2) {
    iVar3 = (*pIVar1->_vptr_ITracker[7])(pIVar1);
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x60))
              (&local_40,(long *)CONCAT44(extraout_var,iVar3),nameAndLocation);
    if (local_40 == (GeneratorTracker *)0x0) {
      __assert_fail("thisTracker",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/olivermichel[P]libom2/test/include/catch.h"
                    ,0x3145,
                    "static GeneratorTracker &Catch::Generators::GeneratorTracker::acquire(TrackerContext &, const TestCaseTracking::NameAndLocation &)"
                   );
    }
    iVar3 = (*(local_40->super_TrackerBase).super_ITracker._vptr_ITracker[0xf])();
    if ((char)iVar3 == '\0') {
      __assert_fail("thisTracker->isGeneratorTracker()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/olivermichel[P]libom2/test/include/catch.h"
                    ,0x3146,
                    "static GeneratorTracker &Catch::Generators::GeneratorTracker::acquire(TrackerContext &, const TestCaseTracking::NameAndLocation &)"
                   );
    }
    this._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38;
    pGVar4 = local_40;
    if (local_38 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00137009;
    if (__libc_single_threaded == '\0') {
LAB_00136f7b:
      LOCK();
      local_38->_M_use_count = local_38->_M_use_count + 1;
      UNLOCK();
      this._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38;
      pGVar4 = local_40;
      goto LAB_00136ffa;
    }
    local_38->_M_use_count = local_38->_M_use_count + 1;
  }
  else {
    (*pIVar1->_vptr_ITracker[0xc])(&local_40,pIVar1,nameAndLocation);
    if (local_40 == (GeneratorTracker *)0x0) {
      local_30 = (GeneratorTracker *)0x0;
      local_20 = pIVar1;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Catch::Generators::GeneratorTracker,std::allocator<Catch::Generators::GeneratorTracker>,Catch::TestCaseTracking::NameAndLocation_const&,Catch::TestCaseTracking::TrackerContext&,Catch::TestCaseTracking::ITracker*>
                (&local_28,&local_30,(allocator<Catch::Generators::GeneratorTracker> *)&local_41,
                 nameAndLocation,ctx,&local_20);
      this._M_pi = local_28._M_pi;
      pGVar4 = local_30;
      if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_28._M_pi)->_M_use_count = (local_28._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_28._M_pi)->_M_use_count = (local_28._M_pi)->_M_use_count + 1;
        }
      }
      (*pIVar1->_vptr_ITracker[0xb])(pIVar1,&local_30);
      if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._M_pi);
      }
    }
    else {
      iVar3 = (*(local_40->super_TrackerBase).super_ITracker._vptr_ITracker[0xf])();
      if ((char)iVar3 == '\0') {
        __assert_fail("childTracker->isGeneratorTracker()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/olivermichel[P]libom2/test/include/catch.h"
                      ,0x314a,
                      "static GeneratorTracker &Catch::Generators::GeneratorTracker::acquire(TrackerContext &, const TestCaseTracking::NameAndLocation &)"
                     );
      }
      pGVar4 = local_40;
      if (local_38 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        this._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        if (__libc_single_threaded == '\0') goto LAB_00136f7b;
        local_38->_M_use_count = local_38->_M_use_count + 1;
        this._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38;
      }
    }
LAB_00136ffa:
    if (local_38 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00137009;
  }
  clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
LAB_00137009:
  iVar3 = (*(pGVar4->super_TrackerBase).super_ITracker._vptr_ITracker[2])(pGVar4);
  if ((char)iVar3 == '\0') {
    (pGVar4->super_TrackerBase).m_runState = Executing;
    ((pGVar4->super_TrackerBase).m_ctx)->m_currentTracker = (ITracker *)pGVar4;
    pIVar1 = (pGVar4->super_TrackerBase).m_parent;
    if (pIVar1 != (ITracker *)0x0) {
      (*pIVar1->_vptr_ITracker[0xd])();
    }
  }
  if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_pi);
  }
  return pGVar4;
}

Assistant:

static GeneratorTracker& acquire( TrackerContext& ctx, TestCaseTracking::NameAndLocation const& nameAndLocation ) {
                std::shared_ptr<GeneratorTracker> tracker;

                ITracker& currentTracker = ctx.currentTracker();
                // Under specific circumstances, the generator we want
                // to acquire is also the current tracker. If this is
                // the case, we have to avoid looking through current
                // tracker's children, and instead return the current
                // tracker.
                // A case where this check is important is e.g.
                //     for (int i = 0; i < 5; ++i) {
                //         int n = GENERATE(1, 2);
                //     }
                //
                // without it, the code above creates 5 nested generators.
                if (currentTracker.nameAndLocation() == nameAndLocation) {
                    auto thisTracker = currentTracker.parent().findChild(nameAndLocation);
                    assert(thisTracker);
                    assert(thisTracker->isGeneratorTracker());
                    tracker = std::static_pointer_cast<GeneratorTracker>(thisTracker);
                } else if ( TestCaseTracking::ITrackerPtr childTracker = currentTracker.findChild( nameAndLocation ) ) {
                    assert( childTracker );
                    assert( childTracker->isGeneratorTracker() );
                    tracker = std::static_pointer_cast<GeneratorTracker>( childTracker );
                } else {
                    tracker = std::make_shared<GeneratorTracker>( nameAndLocation, ctx, &currentTracker );
                    currentTracker.addChild( tracker );
                }

                if( !tracker->isComplete() ) {
                    tracker->open();
                }

                return *tracker;
            }